

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O2

t_int * sighip_perform(t_int *w)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  t_bigorsmall32 pun;
  float fVar7;
  float fVar8;
  float fVar9;
  
  lVar2 = w[1];
  lVar3 = w[2];
  pfVar4 = (float *)w[3];
  uVar1 = *(uint *)(w + 4);
  fVar8 = pfVar4[1];
  if (1.0 <= fVar8) {
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    for (; (int)uVar5 != (int)uVar6; uVar6 = uVar6 + 1) {
      *(undefined4 *)(lVar3 + uVar6 * 4) = *(undefined4 *)(lVar2 + uVar6 * 4);
    }
    fVar8 = 0.0;
  }
  else {
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    fVar7 = *pfVar4;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    for (; (int)uVar5 != (int)uVar6; uVar6 = uVar6 + 1) {
      fVar9 = fVar8 * fVar7 + *(float *)(lVar2 + uVar6 * 4);
      *(float *)(lVar3 + uVar6 * 4) = (fVar9 - fVar7) * (fVar8 + 1.0) * 0.5;
      fVar7 = fVar9;
    }
    fVar8 = 0.0;
    if ((((uint)fVar7 >> 0x1d ^ (uint)fVar7 >> 0x1e) & 1) != 0) {
      fVar8 = fVar7;
    }
  }
  *pfVar4 = fVar8;
  return w + 5;
}

Assistant:

static t_int *sighip_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    t_hipctl *c = (t_hipctl *)(w[3]);
    int n = (int)w[4];
    int i;
    t_sample last = c->c_x;
    t_sample coef = c->c_coef;
    if (coef < 1)
    {
        t_sample normal = 0.5*(1+coef);
        for (i = 0; i < n; i++)
        {
            t_sample new = *in++ + coef * last;
            *out++ = normal * (new - last);
            last = new;
        }
        if (PD_BIGORSMALL(last))
            last = 0;
        c->c_x = last;
    }
    else
    {
        for (i = 0; i < n; i++)
            *out++ = *in++;
        c->c_x = 0;
    }
    return (w+5);
}